

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_13::NameApplier::UseNameForParamAndLocalVar
          (NameApplier *this,Func *func,Var *var)

{
  __type _Var1;
  Index IVar2;
  Index IVar3;
  Enum EVar4;
  string *__rhs;
  string_view name_00;
  string name;
  
  IVar2 = Func::GetLocalIndex(func,var);
  IVar3 = Func::GetNumParamsAndLocals(func);
  if (IVar2 < IVar3) {
    std::__cxx11::string::string
              ((string *)&name,
               (string *)
               ((this->param_and_local_index_to_name_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + IVar2));
    if (var->type_ == Name) {
      __rhs = Var::name_abi_cxx11_(var);
      _Var1 = std::operator==(&name,__rhs);
      if (!_Var1) {
        __assert_fail("name == var->name()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/apply-names.cc"
                      ,0xe8,
                      "Result wabt::(anonymous namespace)::NameApplier::UseNameForParamAndLocalVar(Func *, Var *)"
                     );
      }
    }
    else if (name._M_string_length != 0) {
      name_00._M_str = name._M_dataplus._M_p;
      name_00._M_len = name._M_string_length;
      Var::set_name(var,name_00);
    }
    std::__cxx11::string::_M_dispose();
    EVar4 = Ok;
  }
  else {
    EVar4 = Error;
  }
  return (Result)EVar4;
}

Assistant:

Result NameApplier::UseNameForParamAndLocalVar(Func* func, Var* var) {
  Index local_index = func->GetLocalIndex(*var);
  if (local_index >= func->GetNumParamsAndLocals()) {
    return Result::Error;
  }

  std::string name = param_and_local_index_to_name_[local_index];
  if (var->is_name()) {
    assert(name == var->name());
    return Result::Ok;
  }

  if (!name.empty()) {
    var->set_name(name);
  }
  return Result::Ok;
}